

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

parser_value * parser_getval(parser *p,char *name)

{
  int iVar1;
  parser_value *local_28;
  parser_value *v;
  char *name_local;
  parser *p_local;
  
  local_28 = p->fhead;
  while( true ) {
    if (local_28 == (parser_value *)0x0) {
      quit_fmt("parser_getval error: name is %s\n",name);
      return (parser_value *)0x0;
    }
    iVar1 = strcmp((local_28->spec).name,name);
    if (iVar1 == 0) break;
    local_28 = (parser_value *)(local_28->spec).next;
  }
  return local_28;
}

Assistant:

static struct parser_value *parser_getval(struct parser *p, const char *name) {
	struct parser_value *v;
	for (v = p->fhead; v; v = (struct parser_value *)v->spec.next) {
		if (streq(v->spec.name, name)) {
			return v;
		}
	}
	quit_fmt("parser_getval error: name is %s\n", name);
	return 0; /* Needed to avoid Windows compiler warning */
}